

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp.h
# Opt level: O2

double __thiscall
mp::internal::BasicRandomAffineExprExtractor<mp::(anonymous_namespace)::VariableCollector>::
VisitUnary(BasicRandomAffineExprExtractor<mp::(anonymous_namespace)::VariableCollector> *this,
          UnaryExpr e)

{
  double dVar1;
  double dVar2;
  
  if (*(int *)e.super_BasicExpr<(mp::expr::Kind)4,_(mp::expr::Kind)24>.super_ExprBase.impl_ == 4) {
    dVar1 = this->coef_;
    this->coef_ = -dVar1;
    dVar2 = BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
            ::Visit((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                     *)this,(Expr)((ExprBase *)
                                  ((long)e.super_BasicExpr<(mp::expr::Kind)4,_(mp::expr::Kind)24>.
                                         super_ExprBase.impl_ + 8))->impl_);
    this->coef_ = dVar1;
    return -dVar2;
  }
  dVar1 = BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
          ::VisitUnary((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                        *)e.super_BasicExpr<(mp::expr::Kind)4,_(mp::expr::Kind)24>.super_ExprBase.
                          impl_,(UnaryExpr)
                                e.super_BasicExpr<(mp::expr::Kind)4,_(mp::expr::Kind)24>.
                                super_ExprBase.impl_);
  return dVar1;
}

Assistant:

double VisitUnary(UnaryExpr e) {
    if (e.kind() != expr::MINUS)
      return Base::VisitUnary(e);
    double saved_coef = coef_;
    coef_ = -coef_;
    double result = -this->Visit(e.arg());
    coef_ = saved_coef;
    return result;
  }